

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

void __thiscall
wabt::interp::RefPtr<wabt::interp::DefinedFunc>::RefPtr
          (RefPtr<wabt::interp::DefinedFunc> *this,Store *store,Ref ref)

{
  Instr instr;
  bool bVar1;
  RunResult RVar2;
  Index IVar3;
  unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_> *puVar4;
  undefined8 extraout_RDX;
  undefined8 unaff_RBX;
  Store *out_trap;
  undefined8 unaff_R14;
  Value value;
  uint uStack_34;
  Store *pSStack_30;
  Ref local_20;
  
  pSStack_30 = (Store *)0x158e73;
  bVar1 = Store::Is<wabt::interp::DefinedFunc>(store,ref);
  if (bVar1) {
    pSStack_30 = (Store *)0x158e88;
    local_20.index = ref.index;
    IVar3 = FreeList<wabt::interp::Ref>::New<wabt::interp::Ref&>(&store->roots_,&local_20);
    this->root_index_ = IVar3;
    pSStack_30 = (Store *)0x158e98;
    puVar4 = FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
             ::Get(&store->objects_,ref.index);
    this->obj_ = (DefinedFunc *)
                 (puVar4->_M_t).
                 super___uniq_ptr_impl<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::interp::Object_*,_std::default_delete<wabt::interp::Object>_>
                 .super__Head_base<0UL,_wabt::interp::Object_*,_false>._M_head_impl;
    this->store_ = store;
    return;
  }
  pSStack_30 = (Store *)0x158eb7;
  out_trap = store;
  interp::RefPtr();
  instr.field_2.imm_u64 = unaff_RBX;
  instr.op.enum_ = (undefined4)local_20.index;
  instr.kind = local_20.index._4_4_;
  instr.field_2._8_8_ = unaff_R14;
  pSStack_30 = store;
  RVar2 = Thread::Load<unsigned_int>((Thread *)ref.index,instr,&uStack_34,(Ptr *)out_trap);
  if (RVar2 == Ok) {
    value.i64_._4_4_ = 0;
    value.i32_ = uStack_34;
    value._8_8_ = extraout_RDX;
    Thread::Push((Thread *)ref.index,value);
  }
  return;
}

Assistant:

RefPtr<T>::RefPtr(Store& store, Ref ref) {
#ifndef NDEBUG
  if (!store.Is<T>(ref)) {
    ObjectKind ref_kind;
    if (ref == Ref::Null) {
      ref_kind = ObjectKind::Null;
    } else {
      ref_kind = store.objects_.Get(ref.index)->kind();
    }
    fprintf(stderr, "Invalid conversion from Ref (%s) to RefPtr<%s>!\n",
            GetName(ref_kind), T::GetTypeName());
    abort();
  }
#endif
  root_index_ = store.NewRoot(ref);
  obj_ = static_cast<T*>(store.objects_.Get(ref.index).get());
  store_ = &store;
}